

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O3

void __thiscall
cursespp::ListWindow::ListWindow
          (ListWindow *this,shared_ptr<cursespp::IScrollAdapter> *adapter,IWindow *parent)

{
  connections_list *pcVar1;
  connections_list *pcVar2;
  shared_ptr<cursespp::IScrollAdapter> local_30;
  
  local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (adapter->super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (adapter->super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ScrollableWindow::ScrollableWindow(&this->super_ScrollableWindow,&local_30,parent);
  if (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ListWindow_001a5b38;
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&DAT_001a5da8;
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler
       = (_func_int **)&PTR__ListWindow_001a5dd8;
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ListWindow_001a5e00;
  (this->super_ScrollableWindow).super_IScrollable._vptr_IScrollable =
       (_func_int **)&PTR__ListWindow_001a5e28;
  (this->super_ScrollableWindow).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ListWindow_001a5e78;
  (this->SelectionChanged).
  super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->SelectionChanged).
                      super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->SelectionChanged).
            super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
            .m_connected_slots;
  *(connections_list **)
   ((long)&(this->SelectionChanged).
           super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
           .m_connected_slots.
           super__List_base<sigslot::_connection_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar1;
  (this->SelectionChanged).
  super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->SelectionChanged).
  super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->SelectionChanged).
  super__signal_base3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal3_001a5eb8;
  (this->Invalidated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->Invalidated).
                      super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar2 = &(this->Invalidated).
            super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
            .m_connected_slots;
  *(connections_list **)
   ((long)&(this->Invalidated).
           super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
           .m_connected_slots.
           super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar2;
  (this->Invalidated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar2;
  (this->Invalidated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->Invalidated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a5f68;
  (this->EntryActivated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->EntryActivated).
                      super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar2 = &(this->EntryActivated).
            super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
            .m_connected_slots;
  *(connections_list **)
   ((long)&(this->EntryActivated).
           super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
           .m_connected_slots.
           super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar2;
  (this->EntryActivated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar2;
  (this->EntryActivated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->EntryActivated).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a5f68;
  (this->EntryContextMenu).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->EntryContextMenu).
                      super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar2 = &(this->EntryContextMenu).
            super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
            .m_connected_slots;
  *(connections_list **)
   ((long)&(this->EntryContextMenu).
           super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
           .m_connected_slots.
           super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar2;
  (this->EntryContextMenu).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar2;
  (this->EntryContextMenu).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->EntryContextMenu).
  super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a5f68;
  this->showScrollbar = true;
  (this->scrollPosition).firstVisibleEntryIndex = 0;
  (this->scrollPosition).visibleEntryCount = 0;
  (this->scrollPosition).lineCount = 0;
  (this->scrollPosition).totalEntries = 0;
  (this->scrollPosition).logicalIndex = 0;
  this->selectedIndex = 0;
  *(undefined8 *)&(this->decorator).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->decorator).super__Function_base._M_functor + 8) = 0;
  (this->decorator).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->decorator)._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

ListWindow::ListWindow(std::shared_ptr<IScrollAdapter> adapter, IWindow *parent)
: ScrollableWindow(adapter, parent)
, selectedIndex(0)
, showScrollbar(true) {

}